

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_recho(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA **ppDVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DESCRIPTOR_DATA *pDVar5;
  char buffer [9216];
  char acStack_2438 [9224];
  
  if (*argument == '\0') {
    send_to_char("Local echo what?\n\r",ch);
    return;
  }
  pDVar5 = descriptor_list;
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    do {
      if ((pDVar5->connected == 0) && (pDVar5->character->in_room == ch->in_room)) {
        colorconv(acStack_2438,argument,pDVar5->character);
        iVar3 = get_trust(pDVar5->character);
        iVar4 = get_trust(ch);
        if ((iVar4 <= iVar3) && (bVar2 = is_npc(ch), !bVar2)) {
          send_to_char("local> ",pDVar5->character);
        }
        send_to_char(acStack_2438,pDVar5->character);
        send_to_char("\n\r",pDVar5->character);
      }
      ppDVar1 = &pDVar5->next;
      pDVar5 = *ppDVar1;
    } while (*ppDVar1 != (DESCRIPTOR_DATA *)0x0);
  }
  return;
}

Assistant:

void do_recho(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Local echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character->in_room == ch->in_room)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch) && !is_npc(ch))
				send_to_char("local> ", d->character);

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}